

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

bool __thiscall duckdb::LogConfig::IsConsistent(LogConfig *this)

{
  LogMode LVar1;
  
  LVar1 = this->mode;
  if (LVar1 == ENABLE_SELECTED) {
    if ((this->enabled_log_types)._M_h._M_element_count != 0) {
LAB_00eb3a46:
      return (this->disabled_log_types)._M_h._M_element_count == 0;
    }
  }
  else if (LVar1 == DISABLE_SELECTED) {
    if ((this->enabled_log_types)._M_h._M_element_count == 0) {
      return (this->disabled_log_types)._M_h._M_element_count != 0;
    }
  }
  else if ((LVar1 == LEVEL_ONLY) && ((this->enabled_log_types)._M_h._M_element_count == 0))
  goto LAB_00eb3a46;
  return false;
}

Assistant:

bool LogConfig::IsConsistent() const {
	if (mode == LogMode::LEVEL_ONLY) {
		return enabled_log_types.empty() && disabled_log_types.empty();
	}
	if (mode == LogMode::DISABLE_SELECTED) {
		return enabled_log_types.empty() && !disabled_log_types.empty();
	}
	if (mode == LogMode::ENABLE_SELECTED) {
		return !enabled_log_types.empty() && disabled_log_types.empty();
	}
	return false;
}